

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpObject(FILE *output,xmlXPathObjectPtr cur,int depth)

{
  int iVar1;
  undefined1 local_88 [8];
  char shift [100];
  int i;
  int depth_local;
  xmlXPathObjectPtr cur_local;
  FILE *output_local;
  
  if (output != (FILE *)0x0) {
    shift[0x60] = '\0';
    shift[0x61] = '\0';
    shift[0x62] = '\0';
    shift[99] = '\0';
    for (; (int)shift._96_4_ < depth && (int)shift._96_4_ < 0x19; shift._96_4_ = shift._96_4_ + 1) {
      local_88[shift._96_4_ * 2 + 1] = 0x20;
      local_88[(int)(shift._96_4_ << 1)] = 0x20;
    }
    local_88[shift._96_4_ * 2 + 1] = 0;
    local_88[(int)(shift._96_4_ << 1)] = 0;
    fprintf((FILE *)output,"%s",local_88);
    if (cur == (xmlXPathObjectPtr)0x0) {
      fprintf((FILE *)output,"Object is empty (NULL)\n");
    }
    else {
      switch(cur->type) {
      case XPATH_UNDEFINED:
        fprintf((FILE *)output,"Object is uninitialized\n");
        break;
      case XPATH_NODESET:
        fprintf((FILE *)output,"Object is a Node Set :\n");
        xmlXPathDebugDumpNodeSet(output,cur->nodesetval,depth);
        break;
      case XPATH_BOOLEAN:
        fprintf((FILE *)output,"Object is a Boolean : ");
        if (cur->boolval == 0) {
          fprintf((FILE *)output,"false\n");
        }
        else {
          fprintf((FILE *)output,"true\n");
        }
        break;
      case XPATH_NUMBER:
        iVar1 = xmlXPathIsInf(cur->floatval);
        if (iVar1 == -1) {
          fprintf((FILE *)output,"Object is a number : -Infinity\n");
        }
        else if (iVar1 == 1) {
          fprintf((FILE *)output,"Object is a number : Infinity\n");
        }
        else {
          iVar1 = xmlXPathIsNaN(cur->floatval);
          if (iVar1 == 0) {
            if ((cur->floatval != 0.0) || (NAN(cur->floatval))) {
              fprintf((FILE *)output,"Object is a number : %0g\n",cur->floatval);
            }
            else {
              fprintf((FILE *)output,"Object is a number : 0\n");
            }
          }
          else {
            fprintf((FILE *)output,"Object is a number : NaN\n");
          }
        }
        break;
      case XPATH_STRING:
        fprintf((FILE *)output,"Object is a string : ");
        xmlDebugDumpString(output,cur->stringval);
        fprintf((FILE *)output,"\n");
        break;
      case XPATH_USERS:
        fprintf((FILE *)output,"Object is user defined\n");
        break;
      case XPATH_XSLT_TREE:
        fprintf((FILE *)output,"Object is an XSLT value tree :\n");
        xmlXPathDebugDumpValueTree(output,cur->nodesetval,depth);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathDebugDumpObject(FILE *output, xmlXPathObjectPtr cur, int depth) {
    int i;
    char shift[100];

    if (output == NULL) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;


    fprintf(output, "%s", shift);

    if (cur == NULL) {
        fprintf(output, "Object is empty (NULL)\n");
	return;
    }
    switch(cur->type) {
        case XPATH_UNDEFINED:
	    fprintf(output, "Object is uninitialized\n");
	    break;
        case XPATH_NODESET:
	    fprintf(output, "Object is a Node Set :\n");
	    xmlXPathDebugDumpNodeSet(output, cur->nodesetval, depth);
	    break;
	case XPATH_XSLT_TREE:
	    fprintf(output, "Object is an XSLT value tree :\n");
	    xmlXPathDebugDumpValueTree(output, cur->nodesetval, depth);
	    break;
        case XPATH_BOOLEAN:
	    fprintf(output, "Object is a Boolean : ");
	    if (cur->boolval) fprintf(output, "true\n");
	    else fprintf(output, "false\n");
	    break;
        case XPATH_NUMBER:
	    switch (xmlXPathIsInf(cur->floatval)) {
	    case 1:
		fprintf(output, "Object is a number : Infinity\n");
		break;
	    case -1:
		fprintf(output, "Object is a number : -Infinity\n");
		break;
	    default:
		if (xmlXPathIsNaN(cur->floatval)) {
		    fprintf(output, "Object is a number : NaN\n");
		} else if (cur->floatval == 0) {
                    /* Omit sign for negative zero. */
		    fprintf(output, "Object is a number : 0\n");
		} else {
		    fprintf(output, "Object is a number : %0g\n", cur->floatval);
		}
	    }
	    break;
        case XPATH_STRING:
	    fprintf(output, "Object is a string : ");
	    xmlDebugDumpString(output, cur->stringval);
	    fprintf(output, "\n");
	    break;
	case XPATH_USERS:
	    fprintf(output, "Object is user defined\n");
	    break;
    }
}